

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_> *
benchmark::anon_unknown_1::RunBenchmark
          (Instance *b,
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          *complexity_reports)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  string *psVar4;
  double *pdVar5;
  string *in_RSI;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *in_RDI;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  additional_run_stats;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  stat_reports;
  thread *thread_1;
  iterator __end3;
  iterator __begin3;
  vector<std::thread,_std::allocator<std::thread>_> *__range3;
  double next_iters;
  bool is_significant;
  double multiplier;
  double items_per_second;
  double bytes_per_second;
  Run report;
  double min_time;
  error_message_type error_msg;
  MutexLock l_1;
  string label;
  double seconds;
  double manual_accumulated_time;
  double real_accumulated_time;
  double cpu_accumulated_time;
  size_t ti;
  thread *thread;
  iterator __end5;
  iterator __begin5;
  vector<std::thread,_std::allocator<std::thread>_> *__range5;
  ThreadStats total;
  Notification done;
  MutexLock l;
  string mem;
  int i;
  bool report_aggregates_only;
  int repeats;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  size_t iters;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *reports;
  undefined4 in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  Run *in_stack_fffffffffffffb20;
  value_type *in_stack_fffffffffffffb28;
  TimerManager *in_stack_fffffffffffffb30;
  size_type in_stack_fffffffffffffb38;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_fffffffffffffb40;
  ostream *in_stack_fffffffffffffb48;
  TimerManager *in_stack_fffffffffffffb50;
  ostream *in_stack_fffffffffffffb58;
  Notification *in_stack_fffffffffffffb60;
  __normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
  in_stack_fffffffffffffb68;
  __normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
  in_stack_fffffffffffffb70;
  const_iterator in_stack_fffffffffffffb78;
  double local_468;
  __pointer_type local_450;
  double local_448;
  ThreadStats *in_stack_fffffffffffffbd8;
  ostream *in_stack_fffffffffffffbe0;
  int thread_id;
  ostream *in_stack_fffffffffffffbe8;
  Instance *in_stack_fffffffffffffbf0;
  byte local_376;
  byte local_375;
  int32_t local_374;
  undefined1 local_310 [56];
  thread *local_2d8;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_2d0;
  vector<std::thread,_std::allocator<std::thread>_> *local_2c8;
  double local_2c0;
  double local_2b8;
  Notification *local_2b0;
  double local_2a8;
  undefined1 local_299;
  double local_298;
  double local_290;
  int local_284;
  double local_280;
  double local_278;
  string local_270 [32];
  string local_250 [32];
  byte local_230;
  string local_228 [32];
  long local_208;
  undefined4 local_200;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *local_1f8;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *local_1f0;
  double local_1e8;
  double local_1e0;
  int local_1d0;
  undefined8 local_1c8;
  int local_1c0;
  double local_1b8;
  __pointer_type local_1b0;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *in_stack_fffffffffffffe68;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *local_178;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *local_170;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *in_stack_fffffffffffffe98;
  ulong local_130;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_118;
  vector<std::thread,_std::allocator<std::thread>_> *local_110;
  ThreadStats local_108 [6];
  string local_78 [32];
  int local_58;
  byte local_51;
  int local_50;
  vector<std::thread,_std::allocator<std::thread>_> local_40;
  ulong local_28;
  byte local_19;
  string *local_10;
  undefined4 uVar9;
  
  local_19 = 0;
  local_10 = in_RSI;
  std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  ::vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            *)0x16956f);
  local_28 = 1;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x169588);
  if (((byte)local_10[0x74] & 1) != 0) {
    std::vector<std::thread,_std::allocator<std::thread>_>::resize
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  }
  if (*(int *)(local_10 + 100) == 0) {
    local_374 = FLAGS_benchmark_repetitions;
  }
  else {
    local_374 = *(int32_t *)(local_10 + 100);
  }
  local_50 = local_374;
  local_375 = 0;
  if (local_374 != 1) {
    if (*(int *)(local_10 + 0x28) == 0) {
      local_376 = FLAGS_benchmark_report_aggregates_only;
    }
    else {
      local_376 = *(int *)(local_10 + 0x28) == 2;
    }
    local_375 = local_376;
  }
  local_51 = local_375 & 1;
  for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
    std::__cxx11::string::string(local_78);
    do {
      thread_id = (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
      poVar2 = internal::GetLogInstanceForLevel(in_stack_fffffffffffffb1c);
      poVar2 = std::operator<<(poVar2,"-- LOG(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      poVar2 = std::operator<<(poVar2,"): ");
      poVar2 = std::operator<<(poVar2,"Running ");
      poVar2 = std::operator<<(poVar2,local_10);
      poVar2 = std::operator<<(poVar2," for ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
      std::operator<<(poVar2,"\n");
      GetBenchmarkLock();
      MutexLock::MutexLock
                ((MutexLock *)in_stack_fffffffffffffb20,
                 (Mutex *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      (anonymous_namespace)::GetReportLabel_abi_cxx11_();
      std::__cxx11::string::clear();
      MutexLock::~MutexLock((MutexLock *)0x1697d5);
      std::atomic<const_char_*>::operator=
                ((atomic<const_char_*> *)in_stack_fffffffffffffb20,
                 (__pointer_type)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      Notification::Notification((Notification *)in_stack_fffffffffffffb20);
      operator_new(0xa8);
      TimerManager::TimerManager
                (in_stack_fffffffffffffb30,(int)((ulong)in_stack_fffffffffffffb28 >> 0x20),
                 (Notification *)in_stack_fffffffffffffb20);
      std::
      unique_ptr<benchmark::(anonymous_namespace)::TimerManager,std::default_delete<benchmark::(anonymous_namespace)::TimerManager>>
      ::unique_ptr<std::default_delete<benchmark::(anonymous_namespace)::TimerManager>,void>
                ((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                  *)in_stack_fffffffffffffb20,
                 (pointer)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      std::
      unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
      ::operator=((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                   *)in_stack_fffffffffffffb20,
                  (unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                   *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      std::
      unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
      ::~unique_ptr((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                     *)in_stack_fffffffffffffb20);
      ThreadStats::ThreadStats(local_108);
      (anonymous_namespace)::running_benchmark = 1;
      if (((byte)local_10[0x74] & 1) == 0) {
        RunInThread(in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,thread_id,
                    in_stack_fffffffffffffbd8);
      }
      else {
        local_110 = &local_40;
        local_118._M_current =
             (thread *)
             std::vector<std::thread,_std::allocator<std::thread>_>::begin
                       ((vector<std::thread,_std::allocator<std::thread>_> *)
                        CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        std::vector<std::thread,_std::allocator<std::thread>_>::end
                  ((vector<std::thread,_std::allocator<std::thread>_> *)
                   CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                   *)in_stack_fffffffffffffb20,
                                  (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18)),
              bVar1) {
          __gnu_cxx::
          __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
          ::operator*(&local_118);
          bVar1 = std::thread::joinable((thread *)in_stack_fffffffffffffb20);
          if (bVar1) {
            std::thread::join();
          }
          __gnu_cxx::
          __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
          ::operator++(&local_118);
        }
        for (local_130 = 0;
            sVar3 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&local_40),
            local_130 < sVar3; local_130 = local_130 + 1) {
          std::thread::
          thread<void(*)(benchmark::internal::Benchmark::Instance_const*,unsigned_long,int,benchmark::(anonymous_namespace)::ThreadStats*),benchmark::internal::Benchmark::Instance_const*,unsigned_long&,int,benchmark::(anonymous_namespace)::ThreadStats*,void>
                    ((thread *)in_stack_fffffffffffffb70._M_current,
                     (_func_void_Instance_ptr_unsigned_long_int_ThreadStats_ptr **)
                     in_stack_fffffffffffffb68._M_current,(Instance **)in_stack_fffffffffffffb60,
                     (unsigned_long *)in_stack_fffffffffffffb58,(int *)in_stack_fffffffffffffb50,
                     (ThreadStats **)in_stack_fffffffffffffb48);
          std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_40,local_130);
          std::thread::operator=
                    ((thread *)in_stack_fffffffffffffb20,
                     (thread *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          std::thread::~thread((thread *)0x169a70);
        }
      }
      Notification::WaitForNotification(in_stack_fffffffffffffb60);
      (anonymous_namespace)::running_benchmark = 0;
      std::
      unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
      ::operator->((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                    *)0x169ad0);
      pvVar6 = (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                *)TimerManager::cpu_time_used(in_stack_fffffffffffffb50);
      std::
      unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
      ::operator->((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                    *)0x169b01);
      in_stack_fffffffffffffe98 =
           (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            *)TimerManager::real_time_used(in_stack_fffffffffffffb50);
      std::
      unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
      ::operator->((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                    *)0x169b32);
      local_170 = (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                   *)TimerManager::manual_time_used(in_stack_fffffffffffffb50);
      std::
      unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
      ::reset((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
               *)in_stack_fffffffffffffb20,
              (pointer)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      poVar2 = internal::GetLogInstanceForLevel(in_stack_fffffffffffffb1c);
      poVar2 = std::operator<<(poVar2,"-- LOG(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      in_stack_fffffffffffffbf0 = (Instance *)std::operator<<(poVar2,"): ");
      in_stack_fffffffffffffbe8 = std::operator<<((ostream *)in_stack_fffffffffffffbf0,"Ran in ");
      in_stack_fffffffffffffbe0 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffbe8,(double)pvVar6);
      in_stack_fffffffffffffbd8 = (ThreadStats *)std::operator<<(in_stack_fffffffffffffbe0,"/");
      poVar2 = (ostream *)
               std::ostream::operator<<(in_stack_fffffffffffffbd8,(double)in_stack_fffffffffffffe98)
      ;
      std::operator<<(poVar2,"\n");
      if (((byte)local_10[0x51] & 1) == 0) {
        local_178 = pvVar6;
        if (((byte)local_10[0x50] & 1) != 0) {
          local_178 = in_stack_fffffffffffffe98;
        }
      }
      else {
        local_178 = local_170;
      }
      std::__cxx11::string::string((string *)&stack0xfffffffffffffe68);
      GetBenchmarkLock();
      MutexLock::MutexLock
                ((MutexLock *)in_stack_fffffffffffffb20,
                 (Mutex *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      psVar4 = (anonymous_namespace)::GetReportLabel_abi_cxx11_();
      std::__cxx11::string::operator=((string *)&stack0xfffffffffffffe68,(string *)psVar4);
      MutexLock::~MutexLock((MutexLock *)0x169d12);
      local_1b0 = std::atomic::operator_cast_to_char_((atomic<const_char_*> *)0x169d1e);
      bVar1 = IsZero((double)in_stack_fffffffffffffb20);
      if (bVar1) {
        local_448 = FLAGS_benchmark_min_time;
      }
      else {
        local_448 = *(double *)(local_10 + 0x68);
      }
      local_1b8 = local_448;
      if ((((0 < local_58) || (local_1b0 != (__pointer_type)0x0)) || (999999999 < local_28)) ||
         ((local_448 <= (double)local_178 || (local_448 * 5.0 <= (double)in_stack_fffffffffffffe98))
         )) {
        BenchmarkReporter::Run::Run(in_stack_fffffffffffffb20);
        std::__cxx11::string::operator=(local_270,local_10);
        local_230 = local_1b0 != (__pointer_type)0x0;
        if (local_1b0 == (__pointer_type)0x0) {
          local_450 = "";
        }
        else {
          local_450 = local_1b0;
        }
        std::__cxx11::string::operator=(local_228,local_450);
        std::__cxx11::string::operator=(local_250,(string *)&stack0xfffffffffffffe68);
        local_208 = local_28 * (long)*(int *)(local_10 + 0x70);
        local_200 = *(undefined4 *)(local_10 + 0x48);
        if ((local_230 & 1) == 0) {
          local_278 = 0.0;
          if ((0 < local_108[0].bytes_processed) && (0.0 < (double)local_178)) {
            local_278 = (double)local_108[0].bytes_processed / (double)local_178;
          }
          local_280 = 0.0;
          if ((0 < local_108[0].items_processed) && (0.0 < (double)local_178)) {
            local_280 = (double)local_108[0].items_processed / (double)local_178;
          }
          local_1f8 = in_stack_fffffffffffffe98;
          if (((byte)local_10[0x51] & 1) != 0) {
            local_1f8 = local_170;
          }
          local_1e8 = local_278;
          local_1e0 = local_280;
          local_1c0 = local_108[0].complexity_n;
          local_1d0 = *(int *)(local_10 + 0x54);
          local_1c8 = *(undefined8 *)(local_10 + 0x58);
          local_1f0 = pvVar6;
          if (local_1d0 != 0) {
            std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::push_back((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                         *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
          }
        }
        std::
        vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
        ::push_back((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                     *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        local_284 = 5;
        BenchmarkReporter::Run::~Run(in_stack_fffffffffffffb20);
      }
      else {
        local_298 = 1e-09;
        pdVar5 = std::max<double>((double *)&local_178,&local_298);
        local_468 = (local_448 * 1.4) / *pdVar5;
        local_299 = 0.1 < (double)local_178 / local_1b8;
        if (!(bool)local_299) {
          local_2a8 = 10.0;
          local_290 = local_468;
          pdVar5 = std::min<double>(&local_2a8,&local_290);
          local_468 = *pdVar5;
        }
        local_290 = local_468;
        if (local_468 <= 1.0) {
          local_290 = 2.0;
        }
        uVar9 = (undefined4)(local_28 >> 0x20);
        auVar8._8_4_ = uVar9;
        auVar8._0_8_ = local_28;
        auVar8._12_4_ = 0x45300000;
        local_2b8 = local_290 *
                    ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_28) - 4503599627370496.0));
        auVar7._8_4_ = uVar9;
        auVar7._0_8_ = local_28;
        auVar7._12_4_ = 0x45300000;
        local_2c0 = (auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_28) - 4503599627370496.0) + 1.0;
        pdVar5 = std::max<double>(&local_2b8,&local_2c0);
        local_2b0 = (Notification *)*pdVar5;
        if (1000000000.0 < (double)local_2b0) {
          local_2b0 = (Notification *)0x41cdcd6500000000;
        }
        poVar2 = internal::GetLogInstanceForLevel(in_stack_fffffffffffffb1c);
        in_stack_fffffffffffffb78._M_current = (Run *)std::operator<<(poVar2,"-- LOG(");
        in_stack_fffffffffffffb70._M_current =
             (Run *)std::ostream::operator<<(in_stack_fffffffffffffb78._M_current,3);
        in_stack_fffffffffffffb68._M_current =
             (Run *)std::operator<<((ostream *)in_stack_fffffffffffffb70._M_current,"): ");
        in_stack_fffffffffffffb60 =
             (Notification *)
             std::operator<<((ostream *)in_stack_fffffffffffffb68._M_current,"Next iters: ");
        in_stack_fffffffffffffb58 =
             (ostream *)std::ostream::operator<<(in_stack_fffffffffffffb60,(double)local_2b0);
        in_stack_fffffffffffffb50 = (TimerManager *)std::operator<<(in_stack_fffffffffffffb58,", ");
        in_stack_fffffffffffffb48 =
             (ostream *)std::ostream::operator<<(in_stack_fffffffffffffb50,local_290);
        std::operator<<(in_stack_fffffffffffffb48,"\n");
        local_28 = (ulong)(int)((double)local_2b0 + 0.5);
        local_284 = 0;
      }
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
      Notification::~Notification((Notification *)0x16a3b0);
    } while (local_284 == 0);
    std::__cxx11::string::~string(local_78);
  }
  if (((byte)local_10[0x74] & 1) != 0) {
    local_2c8 = &local_40;
    local_2d0._M_current =
         (thread *)
         std::vector<std::thread,_std::allocator<std::thread>_>::begin
                   ((vector<std::thread,_std::allocator<std::thread>_> *)
                    CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    local_2d8 = (thread *)
                std::vector<std::thread,_std::allocator<std::thread>_>::end
                          ((vector<std::thread,_std::allocator<std::thread>_> *)
                           CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                               *)in_stack_fffffffffffffb20,
                              (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18)),
          bVar1) {
      local_310._48_8_ =
           __gnu_cxx::
           __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
           ::operator*(&local_2d0);
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++(&local_2d0);
    }
  }
  ComputeStats(in_stack_fffffffffffffe98);
  if ((*(int *)(local_10 + 0x54) != 0) && (((byte)local_10[0x60] & 1) != 0)) {
    ComputeBigO(in_stack_fffffffffffffe68);
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    end((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
         *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    __gnu_cxx::
    __normal_iterator<benchmark::BenchmarkReporter::Run_const*,std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>>
    ::__normal_iterator<benchmark::BenchmarkReporter::Run*>
              ((__normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                *)in_stack_fffffffffffffb20,
               (__normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    in_stack_fffffffffffffb30 = (TimerManager *)local_310;
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    begin((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    end((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
         *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
    ::
    insert<__gnu_cxx::__normal_iterator<benchmark::BenchmarkReporter::Run*,std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>>,void>
              ((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
               in_stack_fffffffffffffb68);
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    clear((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           *)0x16a5a3);
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    ~vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             *)in_stack_fffffffffffffb30);
  }
  if ((local_51 & 1) != 0) {
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    clear((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           *)0x16a608);
  }
  std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  ::end((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
         *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  __gnu_cxx::
  __normal_iterator<benchmark::BenchmarkReporter::Run_const*,std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>>
  ::__normal_iterator<benchmark::BenchmarkReporter::Run*>
            ((__normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
              *)in_stack_fffffffffffffb20,
             (__normal_iterator<benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
              *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  ::begin((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  ::end((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
         *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>::
  insert<__gnu_cxx::__normal_iterator<benchmark::BenchmarkReporter::Run*,std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>>,void>
            ((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
              *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
             in_stack_fffffffffffffb68);
  local_19 = 1;
  local_284 = 1;
  std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  ::~vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             *)in_stack_fffffffffffffb30);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffb30);
  if ((local_19 & 1) == 0) {
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    ~vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             *)in_stack_fffffffffffffb30);
  }
  return in_RDI;
}

Assistant:

EXCLUDES(GetBenchmarkLock()) {
  std::vector<BenchmarkReporter::Run> reports; // return value

  size_t iters = 1;

  std::vector<std::thread> pool;
  if (b.multithreaded)
    pool.resize(b.threads);

  const int repeats = b.repetitions != 0 ? b.repetitions
                                         : FLAGS_benchmark_repetitions;
  const bool report_aggregates_only = repeats != 1 &&
      (b.report_mode == internal::RM_Unspecified
        ? FLAGS_benchmark_report_aggregates_only
        : b.report_mode == internal::RM_ReportAggregatesOnly);
  for (int i = 0; i < repeats; i++) {
    std::string mem;
    for (;;) {
      // Try benchmark
      VLOG(2) << "Running " << b.name << " for " << iters << "\n";

      {
        MutexLock l(GetBenchmarkLock());
        GetReportLabel()->clear();
      }
      error_message = nullptr;

      Notification done;
      timer_manager = std::unique_ptr<TimerManager>(new TimerManager(b.threads, &done));

      ThreadStats total;
      running_benchmark = true;
      if (b.multithreaded) {
        // If this is out first iteration of the while(true) loop then the
        // threads haven't been started and can't be joined. Otherwise we need
        // to join the thread before replacing them.
        for (std::thread& thread : pool) {
          if (thread.joinable())
            thread.join();
        }
        for (std::size_t ti = 0; ti < pool.size(); ++ti) {
            pool[ti] = std::thread(&RunInThread, &b, iters, static_cast<int>(ti), &total);
        }
      } else {
        // Run directly in this thread
        RunInThread(&b, iters, 0, &total);
      }
      done.WaitForNotification();
      running_benchmark = false;

      const double cpu_accumulated_time = timer_manager->cpu_time_used();
      const double real_accumulated_time = timer_manager->real_time_used();
      const double manual_accumulated_time = timer_manager->manual_time_used();
      timer_manager.reset();

      VLOG(2) << "Ran in " << cpu_accumulated_time << "/"
              << real_accumulated_time << "\n";

      // Base decisions off of real time if requested by this benchmark.
      double seconds = cpu_accumulated_time;
      if (b.use_manual_time) {
          seconds = manual_accumulated_time;
      } else if (b.use_real_time) {
          seconds = real_accumulated_time;
      }

      std::string label;
      {
        MutexLock l(GetBenchmarkLock());
        label = *GetReportLabel();
      }
      error_message_type error_msg = error_message;

      const double min_time = !IsZero(b.min_time) ? b.min_time
                                                  : FLAGS_benchmark_min_time;

      // If this was the first run, was elapsed time or cpu time large enough?
      // If this is not the first run, go with the current value of iter.
      if ((i > 0) || (error_msg != nullptr) ||
          (iters >= kMaxIterations) ||
          (seconds >= min_time) ||
          (real_accumulated_time >= 5*min_time)) {

        // Create report about this benchmark run.
        BenchmarkReporter::Run report;
        report.benchmark_name = b.name;
        report.error_occurred = error_msg != nullptr;
        report.error_message = error_msg != nullptr ? error_msg : "";
        report.report_label = label;
        // Report the total iterations across all threads.
        report.iterations = static_cast<int64_t>(iters) * b.threads;
        report.time_unit = b.time_unit;

        if (!report.error_occurred) {
          double bytes_per_second = 0;
          if (total.bytes_processed > 0 && seconds > 0.0) {
            bytes_per_second = (total.bytes_processed / seconds);
          }
          double items_per_second = 0;
          if (total.items_processed > 0 && seconds > 0.0) {
            items_per_second = (total.items_processed / seconds);
          }

          if (b.use_manual_time) {
            report.real_accumulated_time = manual_accumulated_time;
          } else {
            report.real_accumulated_time = real_accumulated_time;
          }
          report.cpu_accumulated_time = cpu_accumulated_time;
          report.bytes_per_second = bytes_per_second;
          report.items_per_second = items_per_second;
          report.complexity_n = total.complexity_n;
          report.complexity = b.complexity;
          report.complexity_lambda = b.complexity_lambda;
          if(report.complexity != oNone)
            complexity_reports->push_back(report);
        }

        reports.push_back(report);
        break;
      }

      // See how much iterations should be increased by
      // Note: Avoid division by zero with max(seconds, 1ns).
      double multiplier = min_time * 1.4 / std::max(seconds, 1e-9);
      // If our last run was at least 10% of FLAGS_benchmark_min_time then we
      // use the multiplier directly. Otherwise we use at most 10 times
      // expansion.
      // NOTE: When the last run was at least 10% of the min time the max
      // expansion should be 14x.
      bool is_significant = (seconds / min_time) > 0.1;
      multiplier = is_significant ? multiplier : std::min(10.0, multiplier);
      if (multiplier <= 1.0) multiplier = 2.0;
      double next_iters = std::max(multiplier * iters, iters + 1.0);
      if (next_iters > kMaxIterations) {
        next_iters = kMaxIterations;
      }
      VLOG(3) << "Next iters: " << next_iters << ", " << multiplier << "\n";
      iters = static_cast<int>(next_iters + 0.5);
    }
  }
  if (b.multithreaded) {
    for (std::thread& thread : pool)
      thread.join();
  }
  // Calculate additional statistics
  auto stat_reports = ComputeStats(reports);
  if((b.complexity != oNone) && b.last_benchmark_instance) {
    auto additional_run_stats = ComputeBigO(*complexity_reports);
    stat_reports.insert(stat_reports.end(), additional_run_stats.begin(),
                   additional_run_stats.end());
    complexity_reports->clear();
  }

  if (report_aggregates_only) reports.clear();
  reports.insert(reports.end(), stat_reports.begin(), stat_reports.end());
  return reports;
}